

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

bool __thiscall QPDFAcroFormDocumentHelper::hasAcroForm(QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  QPDFObjectHandle local_40;
  string local_30;
  
  QPDF::getRoot((QPDF *)&local_40);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"/AcroForm","");
  bVar1 = QPDFObjectHandle::hasKey(&local_40,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool
QPDFAcroFormDocumentHelper::hasAcroForm()
{
    return qpdf.getRoot().hasKey("/AcroForm");
}